

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_239b3a::SQLiteBuildDB::dump(SQLiteBuildDB *this,raw_ostream *os)

{
  uint uVar1;
  int iVar2;
  raw_ostream *prVar3;
  char *Str;
  longlong N;
  longlong N_00;
  longlong N_01;
  int __oflag;
  double dVar4;
  double dVar5;
  double end;
  double start;
  sqlite3_int64 computed;
  sqlite3_int64 built;
  sqlite3_int64 id_1;
  longlong local_88;
  sqlite3_int64 id;
  char *text;
  undefined8 uStack_70;
  int size;
  sqlite3_stmt *stmt;
  int result;
  string local_40 [8];
  string error;
  lock_guard<std::mutex> guard;
  raw_ostream *os_local;
  SQLiteBuildDB *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)((long)&error.field_2 + 8),&this->dbMutex);
  std::__cxx11::string::string(local_40);
  uVar1 = open(this,(char *)local_40,__oflag);
  if ((uVar1 & 1) == 0) {
    prVar3 = llvm::raw_ostream::operator<<(os,"error: ");
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_((string *)&result,this);
    prVar3 = llvm::raw_ostream::operator<<(prVar3,(string *)&result);
    llvm::raw_ostream::operator<<(prVar3,"\n");
    std::__cxx11::string::~string((string *)&result);
    stmt._4_4_ = 1;
  }
  else {
    stmt._0_4_ = sqlite3_prepare_v2(this->db,"SELECT key, id FROM key_names;",0xffffffff,
                                    &stack0xffffffffffffff90,0);
    if ((int)stmt == 0) {
      llvm::raw_ostream::operator<<(os,"keys:\n");
      while( true ) {
        iVar2 = sqlite3_step(uStack_70);
        if (iVar2 != 100) break;
        iVar2 = sqlite3_column_count(uStack_70);
        if (iVar2 != 2) {
          __assert_fail("sqlite3_column_count(stmt) == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x33d,
                        "virtual void (anonymous namespace)::SQLiteBuildDB::dump(raw_ostream &)");
        }
        text._4_4_ = sqlite3_column_bytes(uStack_70,0);
        id = sqlite3_column_text(uStack_70,0);
        local_88 = sqlite3_column_int64(uStack_70,1);
        prVar3 = llvm::raw_ostream::operator<<(os,local_88);
        prVar3 = llvm::raw_ostream::operator<<(prVar3," -- ");
        llbuild::core::KeyType::KeyType((KeyType *)&id_1,(char *)id,(long)text._4_4_);
        Str = llbuild::core::KeyType::c_str((KeyType *)&id_1);
        prVar3 = llvm::raw_ostream::operator<<(prVar3,Str);
        llvm::raw_ostream::operator<<(prVar3,"\n");
        llbuild::core::KeyType::~KeyType((KeyType *)&id_1);
      }
      sqlite3_finalize(uStack_70);
      stmt._0_4_ = sqlite3_prepare_v2(this->db,
                                      "SELECT key_id, built_at, computed_at, start, end FROM rule_results;"
                                      ,0xffffffff,&stack0xffffffffffffff90,0);
      if ((int)stmt == 0) {
        llvm::raw_ostream::operator<<(os,"\nresults:\n");
        while( true ) {
          iVar2 = sqlite3_step(uStack_70);
          if (iVar2 != 100) break;
          iVar2 = sqlite3_column_count(uStack_70);
          if (iVar2 != 5) {
            __assert_fail("sqlite3_column_count(stmt) == 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                          ,0x351,
                          "virtual void (anonymous namespace)::SQLiteBuildDB::dump(raw_ostream &)");
          }
          N = sqlite3_column_int64(uStack_70,0);
          N_00 = sqlite3_column_int64(uStack_70,1);
          N_01 = sqlite3_column_int64(uStack_70,2);
          dVar4 = (double)sqlite3_column_double(uStack_70,3);
          dVar5 = (double)sqlite3_column_double(uStack_70,4);
          prVar3 = llvm::raw_ostream::operator<<(os,N);
          prVar3 = llvm::raw_ostream::operator<<(prVar3," -- ");
          prVar3 = llvm::raw_ostream::operator<<(prVar3,N_00);
          prVar3 = llvm::raw_ostream::operator<<(prVar3,", ");
          prVar3 = llvm::raw_ostream::operator<<(prVar3,N_01);
          prVar3 = llvm::raw_ostream::operator<<(prVar3,", ");
          prVar3 = llvm::raw_ostream::operator<<(prVar3,dVar5 - dVar4);
          llvm::raw_ostream::operator<<(prVar3,"s\n");
        }
        sqlite3_finalize(uStack_70);
        stmt._4_4_ = 0;
      }
      else {
        stmt._4_4_ = 1;
      }
    }
    else {
      stmt._4_4_ = 1;
    }
  }
  std::__cxx11::string::~string(local_40);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)((long)&error.field_2 + 8));
  return;
}

Assistant:

virtual void dump(raw_ostream& os) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    std::string error;
    if (!open(&error)) {
      os << "error: " << getCurrentErrorMessage() << "\n";
      return;
    }

    // Dump Keys
    int result;
    sqlite3_stmt* stmt;
    result = sqlite3_prepare_v2(db, "SELECT key, id FROM key_names;",
                                -1, &stmt, nullptr);
    if (result != SQLITE_OK)
      return;

    os << "keys:\n";
    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 2);

      auto size = sqlite3_column_bytes(stmt, 0);
      auto text = (const char*) sqlite3_column_text(stmt, 0);

      auto id = sqlite3_column_int64(stmt, 1);

      os << id << " -- " << KeyType(text, size).c_str() << "\n";
    }

    sqlite3_finalize(stmt);

    // Dump Keys
    result = sqlite3_prepare_v2(db, "SELECT key_id, built_at, computed_at, start, end FROM rule_results;",
                                -1, &stmt, nullptr);
    if (result != SQLITE_OK)
      return;

    os << "\nresults:\n";
    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 5);

      auto id = sqlite3_column_int64(stmt, 0);
      auto built = sqlite3_column_int64(stmt, 1);
      auto computed = sqlite3_column_int64(stmt, 2);
      auto start = sqlite3_column_double(stmt, 3);
      auto end = sqlite3_column_double(stmt, 4);

      os << id << " -- " << built << ", " << computed << ", " << end-start << "s\n";
    }

    sqlite3_finalize(stmt);
  }